

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Array<unsigned_char> * __thiscall
kj::ReadableFile::readAllBytes(Array<unsigned_char> *__return_storage_ptr__,ReadableFile *this)

{
  size_t elementCount;
  int iVar1;
  uchar *__src;
  undefined4 extraout_var;
  uchar *__dest;
  uchar *ptrCopy;
  uchar *puVar2;
  Array<unsigned_char> result;
  uchar *local_60;
  size_t local_58;
  undefined8 *local_50;
  ulong capacity;
  
  (*(this->super_FsNode)._vptr_FsNode[2])(&local_60);
  elementCount = local_58;
  __src = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                             (1,local_58,local_58,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  __return_storage_ptr__->ptr = __src;
  __return_storage_ptr__->size_ = local_58;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  iVar1 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,__src);
  capacity = CONCAT44(extraout_var,iVar1);
  if (capacity < local_58) {
    __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                (1,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
    ;
    puVar2 = __dest;
    if (capacity != 0) {
      puVar2 = __dest + capacity;
      memcpy(__dest,__src,capacity);
    }
    local_50 = &kj::_::HeapArrayDisposer::instance;
    if (__src != (uchar *)0x0) {
      __return_storage_ptr__->ptr = (uchar *)0x0;
      __return_storage_ptr__->size_ = 0;
      local_60 = __dest;
      local_58 = (long)puVar2 - (long)__dest;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__src,1,elementCount,
                 elementCount,(_func_void_void_ptr *)0x0);
    }
    __return_storage_ptr__->ptr = __dest;
    __return_storage_ptr__->size_ = (long)puVar2 - (long)__dest;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> ReadableFile::readAllBytes() const {
  Array<byte> result = heapArray<byte>(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapArray(result.slice(0, n));
  }
  return result;
}